

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall rsg::SubValueRangeIterator::next(SubValueRangeIterator *this)

{
  pointer pCVar1;
  int iVar2;
  int iVar3;
  ConstValueRangeAccess curItem;
  ConstValueRangeAccess local_40;
  
  pCVar1 = (this->m_stack).
           super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  curItem.m_max = pCVar1[-1].m_max;
  curItem.m_type = pCVar1[-1].m_type;
  curItem.m_min = pCVar1[-1].m_min;
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCVar1 + -1;
  if ((curItem.m_type)->m_baseType == TYPE_STRUCT) {
    iVar3 = 0;
    iVar2 = (int)(((long)((curItem.m_type)->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((curItem.m_type)->m_members).
                        super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
      ConstValueRangeAccess::member(&local_40,&curItem,iVar3);
      std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::
      emplace_back<rsg::ConstValueRangeAccess>(&this->m_stack,&local_40);
    }
  }
  else if ((curItem.m_type)->m_baseType == TYPE_ARRAY) {
    iVar3 = (curItem.m_type)->m_numElements;
    iVar2 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
      ConstValueRangeAccess::member(&local_40,&curItem,iVar2);
      std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::
      emplace_back<rsg::ConstValueRangeAccess>(&this->m_stack,&local_40);
    }
  }
  return;
}

Assistant:

void SubValueRangeIterator::next (void)
{
	ConstValueRangeAccess curItem = getItem();
	m_stack.pop_back(); // Remove current

	switch (curItem.getType().getBaseType())
	{
		case VariableType::TYPE_ARRAY:
		{
			int numElements = curItem.getType().getNumElements();
			for (int ndx = 0; ndx < numElements; ndx++)
				m_stack.push_back(curItem.member(ndx));
			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)curItem.getType().getMembers().size();
			for (int ndx = 0; ndx < numMembers; ndx++)
				m_stack.push_back(curItem.member(ndx));
			break;
		}

		default:
			break; // \todo [2011-02-03 pyry] Swizzle control?
	}
}